

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_types.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
::Entry(Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
        *this,Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
              *entry)

{
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
  *entry_local;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
  *this_local;
  
  Entry_column_index<unsigned_int>::Entry_column_index
            (&this->super_Entry_column_index_option,&entry->super_Entry_column_index_option);
  Entry_field_element<unsigned_int>::Entry_field_element
            (&this->super_Entry_field_element_option,&entry->super_Entry_field_element_option);
  boost::intrusive::
  set_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>
  ::set_base_hook(&this->super_Column_hook);
  this->rowIndex_ = entry->rowIndex_;
  return;
}

Assistant:

Entry(const Entry& entry)
      : col_opt(static_cast<const col_opt&>(entry)),
        field_opt(static_cast<const field_opt&>(entry)),
        rowIndex_(entry.rowIndex_){}